

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq.c
# Opt level: O0

size_t tester_mq_get_buffsize(mqd_t queue,_Bool *err)

{
  undefined1 local_68 [8];
  mq_attr tmp;
  int tmp_err;
  _Bool *err_local;
  size_t sStack_10;
  mqd_t queue_local;
  
  tmp.__pad[3]._4_4_ = 0;
  tmp.__pad[3]._4_4_ = mq_getattr(queue,(mq_attr *)local_68);
  if (tmp.__pad[3]._4_4_ == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/tester_mq.c"
                  ,"tester_mq_get_buffsize");
    sStack_10 = 0xffffffffffffffff;
  }
  else {
    sStack_10 = tmp.mq_maxmsg;
  }
  return sStack_10;
}

Assistant:

size_t tester_mq_get_buffsize(mqd_t queue, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;
    struct mq_attr tmp;

    tmp_err = mq_getattr(queue, &tmp);
    INT_FAIL_IF(tmp_err == -1);
    return (size_t) tmp.mq_msgsize;
}